

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall
QFontDialogPrivate::helperPrepareShow(QFontDialogPrivate *this,QPlatformDialogHelper *param_2)

{
  QFontDialogOptions *pQVar1;
  QFontDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QSharedPointer<QFontDialogOptions>::operator->
                     ((QSharedPointer<QFontDialogOptions> *)0x795905);
  q_func(in_RDI);
  QWidget::windowTitle((QWidget *)&stack0xffffffffffffffe0);
  QFontDialogOptions::setWindowTitle((QString *)pQVar1);
  QString::~QString((QString *)0x79593e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::helperPrepareShow(QPlatformDialogHelper *)
{
    options->setWindowTitle(q_func()->windowTitle());
}